

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerFactoryTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::TracerFactory_testInvalidConfig_Test::~TracerFactory_testInvalidConfig_Test
          (TracerFactory_testInvalidConfig_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TracerFactory, testInvalidConfig)
{
    const char* invalidConfigTestCases[] = { "",
                                             "abc: {",
                                             R"({
      "service_name": {}
    })" };
    TracerFactory tracerFactory(true);
    for (auto&& invalidConfig : invalidConfigTestCases) {
        std::string errorMessage;
        auto tracerMaybe =
            tracerFactory.MakeTracer(invalidConfig, errorMessage);
        ASSERT_FALSE(tracerMaybe);
        ASSERT_NE(errorMessage, "");
    }
}